

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initiate_post.hpp
# Opt level: O1

void __thiscall
asio::detail::initiate_post_with_executor<asio::any_io_executor>::operator()
          (initiate_post_with_executor<asio::any_io_executor> *this,
          binder1<std::function<void_(const_std::error_code_&)>,_std::error_code> *handler,
          enable_if_t<execution::is_executor<conditional_t<true,_executor_type,_binder1<function<void_(const_error_code_&)>,_error_code>_>_>::value>
          *param_2,enable_if_t<_detail::is_work_dispatcher_required<decay_t<binder1<function<void_(const_error_code_&)>,_error_code>_>,_any_io_executor>::value>
                   *param_3)

{
  _Manager_type p_Var1;
  allocator_t<std::allocator<void>_> local_b9;
  _Any_data local_b8;
  _Manager_type local_a8;
  _Invoker_type local_a0;
  undefined8 local_98;
  error_category *peStack_90;
  enable_if_t<call_traits<impl,_any_io_executor,_void_(const_fork_t<>_&,_allocator_t<allocator<void>_>)>::overload____two_props,_typename_call_traits<impl,_any_io_executor,_void_(const_fork_t<>_&,_allocator_t<allocator<void>_>)>::result_type>
  local_80;
  enable_if_t<call_traits<impl,_const_any_io_executor_&,_void_(const_never_t<0>_&)>::overload____call_member,_typename_call_traits<impl,_const_any_io_executor_&,_void_(const_never_t<0>_&)>::result_type>
  local_48;
  
  asio_require_fn::impl::operator()
            (&local_48,(impl *)&asio_require_fn::static_instance<asio_require_fn::impl>::instance,
             &this->ex_,(never_t<0> *)&asio::execution::detail::blocking_t<0>::never);
  asio_prefer_fn::impl::operator()
            (&local_80,(impl *)&asio_prefer_fn::static_instance<asio_prefer_fn::impl>::instance,
             &local_48,(fork_t<0> *)&asio::execution::detail::relationship_t<0>::fork,&local_b9);
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  local_a8 = (_Manager_type)0x0;
  local_a0 = (handler->handler_)._M_invoker;
  p_Var1 = (handler->handler_).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_b8._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(handler->handler_).super__Function_base._M_functor;
    local_b8._8_8_ = *(undefined8 *)((long)&(handler->handler_).super__Function_base._M_functor + 8)
    ;
    (handler->handler_).super__Function_base._M_manager = (_Manager_type)0x0;
    (handler->handler_)._M_invoker = (_Invoker_type)0x0;
    local_a8 = p_Var1;
  }
  local_98 = *(undefined8 *)&handler->arg1_;
  peStack_90 = (handler->arg1_)._M_cat;
  asio::execution::detail::any_executor_base::
  execute<asio::detail::binder0<asio::detail::binder1<std::function<void(std::error_code_const&)>,std::error_code>>>
            ((any_executor_base *)&local_80,
             (binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>
              *)&local_b8);
  if (local_a8 != (_Manager_type)0x0) {
    (*local_a8)((_Any_data *)&local_b8,(_Any_data *)&local_b8,__destroy_functor);
  }
  if ((target_fns *)
      local_80.
      super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
      .super_any_executor_base.target_ != (target_fns *)0x0) {
    (*(local_80.
       super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
       .super_any_executor_base.object_fns_)->destroy)((any_executor_base *)&local_80);
  }
  if (local_48.
      super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
      .super_any_executor_base.target_ != (void *)0x0) {
    (*(local_48.
       super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
       .super_any_executor_base.object_fns_)->destroy)((any_executor_base *)&local_48);
  }
  return;
}

Assistant:

void operator()(CompletionHandler&& handler,
      enable_if_t<
        execution::is_executor<
          conditional_t<true, executor_type, CompletionHandler>
        >::value
      >* = 0,
      enable_if_t<
        !detail::is_work_dispatcher_required<
          decay_t<CompletionHandler>,
          Executor
        >::value
      >* = 0) const
  {
    associated_allocator_t<decay_t<CompletionHandler>> alloc(
        (get_associated_allocator)(handler));

    asio::prefer(
        asio::require(ex_, execution::blocking.never),
        execution::relationship.fork,
        execution::allocator(alloc)
      ).execute(
        asio::detail::bind_handler(
          static_cast<CompletionHandler&&>(handler)));
  }